

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

float * stbi_loadf_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  stbi_uc *data_00;
  int local_5c;
  stbi_uc *data;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  int len_local;
  stbi_uc *buffer_local;
  
  iVar1 = stbi_hdr_test_memory(buffer,len);
  if (iVar1 == 0) {
    data_00 = stbi_load_from_memory(buffer,len,x,y,comp,req_comp);
    if (data_00 == (stbi_uc *)0x0) {
      e("Image not of any known type, or corrupt");
      buffer_local = (stbi_uc *)0x0;
    }
    else {
      local_5c = req_comp;
      if (req_comp == 0) {
        local_5c = *comp;
      }
      buffer_local = (stbi_uc *)ldr_to_hdr(data_00,*x,*y,local_5c);
    }
  }
  else {
    buffer_local = (stbi_uc *)stbi_hdr_load_from_memory(buffer,len,x,y,comp,req_comp);
  }
  return (float *)buffer_local;
}

Assistant:

float *stbi_loadf_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *data;
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_memory(buffer, len))
      return stbi_hdr_load_from_memory(buffer, len,x,y,comp,req_comp);
   #endif
   data = stbi_load_from_memory(buffer, len, x, y, comp, req_comp);
   if (data)
      return ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return epf("unknown image type", "Image not of any known type, or corrupt");
}